

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPTCPTransmitter::WaitForIncomingData
          (RTPTCPTransmitter *this,RTPTime *delay,bool *dataavailable)

{
  int iVar1;
  bool bVar2;
  SocketType SVar3;
  size_type sVar4;
  size_type sVar5;
  pointer ppVar6;
  reference pvVar7;
  reference pvVar8;
  ulong local_68;
  size_t i;
  bool avail;
  int status;
  int idxAbort;
  int idx;
  iterator end;
  iterator it;
  SocketType abortSocket;
  bool *dataavailable_local;
  RTPTime *delay_local;
  RTPTCPTransmitter *this_local;
  
  if ((this->m_init & 1U) == 0) {
    this_local._4_4_ = -0xb5;
  }
  else if ((this->m_created & 1U) == 0) {
    this_local._4_4_ = -0xbb;
  }
  else if ((this->m_waitingForData & 1U) == 0) {
    sVar4 = std::
            map<int,_jrtplib::RTPTCPTransmitter::SocketData,_std::less<int>,_std::allocator<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>_>
            ::size(&this->m_destSockets);
    std::vector<int,_std::allocator<int>_>::resize(&this->m_tmpSocks,sVar4 + 1);
    sVar5 = std::vector<int,_std::allocator<int>_>::size(&this->m_tmpSocks);
    std::vector<signed_char,_std::allocator<signed_char>_>::resize(&this->m_tmpFlags,sVar5);
    SVar3 = RTPAbortDescriptors::GetAbortSocket(this->m_pAbortDesc);
    end = std::
          map<int,_jrtplib::RTPTCPTransmitter::SocketData,_std::less<int>,_std::allocator<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>_>
          ::begin(&this->m_destSockets);
    _idxAbort = std::
                map<int,_jrtplib::RTPTCPTransmitter::SocketData,_std::less<int>,_std::allocator<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>_>
                ::end(&this->m_destSockets);
    status = 0;
    while (bVar2 = std::operator!=(&end,(_Self *)&idxAbort), bVar2) {
      ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>
               ::operator->(&end);
      iVar1 = ppVar6->first;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_tmpSocks,(long)status);
      *pvVar7 = iVar1;
      pvVar8 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         (&this->m_tmpFlags,(long)status);
      *pvVar8 = '\0';
      std::_Rb_tree_iterator<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>::
      operator++(&end);
      status = status + 1;
    }
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_tmpSocks,(long)status);
    *pvVar7 = SVar3;
    pvVar8 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       (&this->m_tmpFlags,(long)status);
    *pvVar8 = '\0';
    this->m_waitingForData = true;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_tmpSocks,0);
    pvVar8 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[](&this->m_tmpFlags,0)
    ;
    sVar5 = std::vector<int,_std::allocator<int>_>::size(&this->m_tmpSocks);
    this_local._4_4_ = RTPSelect(pvVar7,pvVar8,sVar5,(RTPTime)delay->m_t);
    if (this_local._4_4_ < 0) {
      this->m_waitingForData = false;
    }
    else {
      this->m_waitingForData = false;
      if ((this->m_created & 1U) == 0) {
        this_local._4_4_ = 0;
      }
      else {
        pvVar8 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           (&this->m_tmpFlags,(long)status);
        if (*pvVar8 != '\0') {
          RTPAbortDescriptors::ReadSignallingByte(this->m_pAbortDesc);
        }
        if (dataavailable != (bool *)0x0) {
          bVar2 = false;
          for (local_68 = 0;
              sVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::size
                                (&this->m_tmpFlags), local_68 < sVar5; local_68 = local_68 + 1) {
            pvVar8 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                               (&this->m_tmpFlags,local_68);
            if (*pvVar8 != '\0') {
              bVar2 = true;
              break;
            }
          }
          if (bVar2) {
            *dataavailable = true;
          }
          else {
            *dataavailable = false;
          }
        }
        this_local._4_4_ = 0;
      }
    }
  }
  else {
    this_local._4_4_ = -0xba;
  }
  return this_local._4_4_;
}

Assistant:

int RTPTCPTransmitter::WaitForIncomingData(const RTPTime &delay,bool *dataavailable)
{
	if (!m_init)
		return ERR_RTP_TCPTRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	
	if (!m_created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_NOTCREATED;
	}
	if (m_waitingForData)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_ALREADYWAITING;
	}
	
	m_tmpSocks.resize(m_destSockets.size()+1);
	m_tmpFlags.resize(m_tmpSocks.size());
	SocketType abortSocket = m_pAbortDesc->GetAbortSocket();

	std::map<SocketType, SocketData>::iterator it = m_destSockets.begin();
	std::map<SocketType, SocketData>::iterator end = m_destSockets.end();
	int idx = 0;

	while (it != end)
	{
		m_tmpSocks[idx] = it->first;
		m_tmpFlags[idx] = 0;
		++it;
		idx++;
	}
	m_tmpSocks[idx] = abortSocket;
	m_tmpFlags[idx] = 0;
	int idxAbort = idx;

	m_waitingForData = true;
	
	WAITMUTEX_LOCK
	MAINMUTEX_UNLOCK

	//cout << "Waiting for " << delay.GetDouble() << " seconds for data on " << m_tmpSocks.size() << " sockets" << endl;
	int status = RTPSelect(&m_tmpSocks[0], &m_tmpFlags[0], m_tmpSocks.size(), delay);
	if (status < 0)
	{
		MAINMUTEX_LOCK
		m_waitingForData = false;
		MAINMUTEX_UNLOCK
		WAITMUTEX_UNLOCK
		return status;
	}
	
	MAINMUTEX_LOCK
	m_waitingForData = false;
	if (!m_created) // destroy called
	{
		MAINMUTEX_UNLOCK;
		WAITMUTEX_UNLOCK
		return 0;
	}
		
	// if aborted, read from abort buffer
	if (m_tmpFlags[idxAbort])
		m_pAbortDesc->ReadSignallingByte();

	if (dataavailable != 0)
	{
		bool avail = false;

		for (size_t i = 0 ; i < m_tmpFlags.size() ; i++)
		{
			if (m_tmpFlags[i])
			{
				avail = true;
				//cout << "Data available!" << endl;
				break;
			}
		}

		if (avail)
			*dataavailable = true;
		else
			*dataavailable = false;
	}	
	
	MAINMUTEX_UNLOCK
	WAITMUTEX_UNLOCK
	return 0;
}